

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O2

PVG_FT_Error
ft_stroke_border_cubicto
          (PVG_FT_StrokeBorder border,PVG_FT_Vector *control1,PVG_FT_Vector *control2,
          PVG_FT_Vector *to)

{
  PVG_FT_Byte *pPVar1;
  PVG_FT_Vector *pPVar2;
  PVG_FT_Byte *pPVar3;
  PVG_FT_Pos PVar4;
  ulong uVar5;
  
  if (-1 < border->start) {
    ft_stroke_border_grow(border,3);
    pPVar2 = border->points;
    uVar5 = (ulong)border->num_points;
    pPVar3 = border->tags;
    PVar4 = control1->y;
    pPVar2[uVar5].x = control1->x;
    pPVar2[uVar5].y = PVar4;
    PVar4 = control2->y;
    pPVar2[uVar5 + 1].x = control2->x;
    pPVar2[uVar5 + 1].y = PVar4;
    PVar4 = to->y;
    pPVar2[uVar5 + 2].x = to->x;
    pPVar2[uVar5 + 2].y = PVar4;
    pPVar1 = pPVar3 + uVar5;
    pPVar1[0] = '\x02';
    pPVar1[1] = '\x02';
    pPVar3[uVar5 + 2] = '\x01';
    border->num_points = border->num_points + 3;
    border->movable = '\0';
    return (PVG_FT_Error)pPVar2;
  }
  __assert_fail("border->start >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-ft-stroker.c"
                ,0x186,
                "PVG_FT_Error ft_stroke_border_cubicto(PVG_FT_StrokeBorder, PVG_FT_Vector *, PVG_FT_Vector *, PVG_FT_Vector *)"
               );
}

Assistant:

static PVG_FT_Error ft_stroke_border_cubicto(PVG_FT_StrokeBorder border,
                                            PVG_FT_Vector*      control1,
                                            PVG_FT_Vector*      control2,
                                            PVG_FT_Vector*      to)
{
    PVG_FT_Error error;

    assert(border->start >= 0);

    error = ft_stroke_border_grow(border, 3);
    if (!error) {
        PVG_FT_Vector* vec = border->points + border->num_points;
        PVG_FT_Byte*   tag = border->tags + border->num_points;

        vec[0] = *control1;
        vec[1] = *control2;
        vec[2] = *to;

        tag[0] = PVG_FT_STROKE_TAG_CUBIC;
        tag[1] = PVG_FT_STROKE_TAG_CUBIC;
        tag[2] = PVG_FT_STROKE_TAG_ON;

        border->num_points += 3;
    }

    border->movable = FALSE;

    return error;
}